

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O3

string * __thiscall
vkt::pipeline::(anonymous_namespace)::CacheTestParam::generateTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  undefined8 *puVar6;
  bool in_CL;
  size_type *psVar7;
  ulong uVar8;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  getShaderFlagStr_abi_cxx11_
            (&local_78,(_anonymous_namespace_ *)(ulong)*(uint *)((long)this + 8),
             VK_SHADER_STAGE_VERTEX_BIT,in_CL);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0xade941);
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    lVar3 = plVar4[3];
    local_58->_M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (1 < *(ulong *)((long)this + 0x20)) {
    uVar5 = 1;
    uVar8 = 2;
    do {
      getShaderFlagStr_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)(ulong)*(uint *)((long)this + uVar5 * 4 + 8),
                 VK_SHADER_STAGE_VERTEX_BIT,SUB81(psVar7,0));
      puVar6 = (undefined8 *)std::__cxx11::string::insert((ulong)&local_50,0,'\x01');
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_78.field_2._M_allocated_capacity = *psVar7;
        local_78.field_2._8_8_ = puVar6[3];
        local_78._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar7;
        local_78._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_78._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar2 = uVar8 < *(ulong *)((long)this + 0x20);
      uVar5 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string CacheTestParam::generateTestDescription (void) const
{
	std::string result("Create pipeline cache with " + getShaderFlagStr(m_shaders[0], true));

	for(deUint32 ndx = 1; ndx < m_shaderCount; ndx++)
		result += ' ' + getShaderFlagStr(m_shaders[ndx], true);

	return result;
}